

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O2

uint32_t Image_Function::Sum(Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uchar *puVar4;
  uchar *puVar5;
  ulong uVar6;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>(image,x,y,width,height);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(image);
  uVar1 = image->_rowSize;
  if (uVar1 == width) {
    uVar2 = height;
    uVar3 = 1;
    if (width < 0xffffffff / height) {
      uVar2 = 1;
      uVar3 = height;
    }
    height = uVar2;
    width = width * uVar3;
  }
  uVar3 = 0;
  puVar4 = image->_data + (ulong)x + (ulong)(y * uVar1);
  puVar5 = puVar4 + height * uVar1;
  for (; puVar4 != puVar5; puVar4 = puVar4 + uVar1) {
    for (uVar6 = 0; width != uVar6; uVar6 = uVar6 + 1) {
      uVar3 = uVar3 + puVar4[uVar6];
    }
  }
  return uVar3;
}

Assistant:

uint32_t Sum( const Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height )
    {
        ParameterValidation( image, x, y, width, height );
        VerifyGrayScaleImage( image );
        OptimiseRoi( width, height, image );

        const uint32_t rowSize = image.rowSize();

        const uint8_t * imageY    = image.data() + y * rowSize + x;
        const uint8_t * imageYEnd = imageY + height * rowSize;

        uint32_t sum = 0;

        for( ; imageY != imageYEnd; imageY += rowSize ) {
            const uint8_t * imageX    = imageY;
            const uint8_t * imageXEnd = imageX + width;

            for( ; imageX != imageXEnd; ++imageX )
                sum += (*imageX);
        }

        return sum;
    }